

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::ParsedIR::set_id_bounds(ParsedIR *this,uint32_t bounds)

{
  size_t sVar1;
  pointer local_20;
  uint32_t local_14;
  ParsedIR *pPStack_10;
  uint32_t bounds_local;
  ParsedIR *this_local;
  
  local_14 = bounds;
  pPStack_10 = this;
  SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve(&this->ids,(ulong)bounds);
  while( true ) {
    sVar1 = VectorView<diligent_spirv_cross::Variant>::size
                      (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>);
    if (local_14 <= sVar1) break;
    local_20 = ::std::
               unique_ptr<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
               ::get(&this->pool_group);
    SmallVector<diligent_spirv_cross::Variant,8ul>::
    emplace_back<diligent_spirv_cross::ObjectPoolGroup*>
              ((SmallVector<diligent_spirv_cross::Variant,8ul> *)&this->ids,&local_20);
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,(ulong)local_14);
  return;
}

Assistant:

void ParsedIR::set_id_bounds(uint32_t bounds)
{
	ids.reserve(bounds);
	while (ids.size() < bounds)
		ids.emplace_back(pool_group.get());

	block_meta.resize(bounds);
}